

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

bool google::protobuf::internal::ReflectionOps::IsInitialized
               (Message *message,bool check_fields,bool check_descendants)

{
  FieldDescriptor *pFVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Descriptor *pDVar7;
  Reflection *this;
  Descriptor *this_00;
  MessageLite *pMVar8;
  FieldDescriptor *pFVar9;
  MapFieldBase *this_01;
  Nonnull<const_char_*> pcVar10;
  MessageFactory *pMVar11;
  undefined4 extraout_var;
  ExtensionSet *this_02;
  int index;
  long v2;
  long lVar12;
  FieldDescriptor *this_03;
  FieldDescriptor *field;
  long v1;
  Metadata MVar13;
  MapIterator it;
  MapIterator end_map;
  MapIterator local_c0;
  MapIterator local_78;
  
  MVar13 = Message::GetMetadata(message);
  pDVar7 = MVar13.descriptor;
  this = GetReflectionOrDie(message);
  iVar6 = pDVar7->field_count_;
  v2 = (long)iVar6;
  if (v2 == 0) {
LAB_00300fff:
    if ((check_descendants) && ((this->schema_).extensions_offset_ != -1)) {
      pMVar11 = MessageFactory::generated_factory();
      iVar6 = (*pMVar11->_vptr_MessageFactory[2])(pMVar11,pDVar7);
      this_02 = Reflection::GetExtensionSet(this,message);
      bVar3 = ExtensionSet::IsInitialized(this_02,(MessageLite *)CONCAT44(extraout_var,iVar6));
      if (!bVar3) {
        return false;
      }
    }
    return true;
  }
  if (iVar6 < 1) {
    pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        (0,v2,"index < field_count()");
  }
  else {
    pcVar10 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar10 == (Nonnull<const_char_*>)0x0) {
    this_03 = pDVar7->fields_;
    if (iVar6 < 1) {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (0,v2 + -1,"0 <= index");
    }
    else {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar10 != (Nonnull<const_char_*>)0x0) goto LAB_003010c0;
    v1 = (long)(int)(v2 + -1);
    if (pDVar7->field_count_ < iVar6) {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (v1,(long)pDVar7->field_count_,"index < field_count()");
    }
    else {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      lVar12 = v2 * 0x58;
      pFVar1 = this_03 + v2;
      if (pDVar7->fields_ + v1 == pFVar1 + -1) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (pDVar7->fields_ + v1,pFVar1 + -1,
                             "descriptor->field(field_count - 1) == end - 1");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        pFVar9 = this_03;
        if (check_fields) {
          do {
            bVar3 = FieldDescriptor::is_required(pFVar9);
            if ((bVar3) && (bVar3 = Reflection::HasField(this,message,pFVar9), !bVar3)) {
              return false;
            }
            lVar12 = lVar12 + -0x58;
            pFVar9 = pFVar9 + 1;
          } while (lVar12 != 0);
        }
        if (!check_descendants) {
          return true;
        }
        do {
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_03->type_ * 4) == 10) {
            this_00 = FieldDescriptor::message_type(this_03);
            if ((this_00->options_->field_0)._impl_.map_entry_ == true) {
              pFVar9 = Descriptor::field(this_00,1);
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar9->type_ * 4) == 10) {
                this_01 = Reflection::GetMapData(this,message,this_03);
                bVar3 = MapFieldBase::IsMapValid(this_01);
                if (bVar3) {
                  MapIterator::MapIterator(&local_c0,message,this_03);
                  MapIterator::MapIterator(&local_78,message,this_03);
                  MapFieldBase::MapBegin(this_01,&local_c0);
                  MapFieldBase::MapEnd(this_01,&local_78);
                  while (bVar3 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78),
                        !bVar3) {
                    pMVar8 = &MapValueConstRef::GetMessageValue
                                        (&local_c0.value_.super_MapValueConstRef)->super_MessageLite
                    ;
                    bVar3 = MessageLite::IsInitialized(pMVar8);
                    if (!bVar3) {
                      iVar6 = 1;
                      goto LAB_00300efc;
                    }
                    MapFieldBase::IncreaseIterator(local_c0.map_,&local_c0);
                  }
                }
              }
              goto LAB_00300efa;
            }
            bVar2 = this_03->field_0x1;
            bVar3 = (bool)((bVar2 & 0x20) >> 5);
            if (0xbf < bVar2 == bVar3) {
              pcVar10 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar3,0xbf < bVar2,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar10 != (Nonnull<const_char_*>)0x0) {
              IsInitialized();
              goto LAB_003010b3;
            }
            if ((this_03->field_0x1 & 0x20) == 0) {
              bVar3 = Reflection::HasField(this,message,this_03);
              if (bVar3) {
                pMVar8 = &Reflection::GetMessage(this,message,this_03,(MessageFactory *)0x0)->
                          super_MessageLite;
                bVar3 = MessageLite::IsInitialized(pMVar8);
                iVar6 = 1;
                if (!bVar3) goto LAB_00300efc;
              }
LAB_00300efa:
              iVar6 = 0;
            }
            else {
              iVar5 = Reflection::FieldSize(this,message,this_03);
              bVar3 = 0 < iVar5;
              if (iVar5 < 1) {
                iVar6 = 0;
              }
              else {
                pMVar8 = &Reflection::GetRepeatedMessage(this,message,this_03,0)->super_MessageLite;
                bVar4 = MessageLite::IsInitialized(pMVar8);
                iVar6 = 1;
                if (bVar4) {
                  do {
                    index = iVar6;
                    if (iVar5 == index) {
                      iVar6 = 0;
                      goto LAB_00300ee6;
                    }
                    pMVar8 = &Reflection::GetRepeatedMessage(this,message,this_03,index)->
                              super_MessageLite;
                    bVar3 = MessageLite::IsInitialized(pMVar8);
                    iVar6 = index + 1;
                  } while (bVar3);
                  iVar6 = 1;
LAB_00300ee6:
                  bVar3 = index < iVar5;
                }
              }
              if (!bVar3) goto LAB_00300efa;
            }
LAB_00300efc:
            if (iVar6 != 0) {
              return false;
            }
          }
          this_03 = this_03 + 1;
        } while (this_03 != pFVar1);
        goto LAB_00300fff;
      }
      goto LAB_003010da;
    }
  }
  else {
LAB_003010b3:
    IsInitialized();
LAB_003010c0:
    IsInitialized();
  }
  IsInitialized();
LAB_003010da:
  IsInitialized();
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message, bool check_fields,
                                  bool check_descendants) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);
  if (const int field_count = descriptor->field_count()) {
    const FieldDescriptor* begin = descriptor->field(0);
    const FieldDescriptor* end = begin + field_count;
    ABSL_DCHECK_EQ(descriptor->field(field_count - 1), end - 1);

    if (check_fields) {
      // Check required fields of this message.
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->is_required() && !reflection->HasField(message, field)) {
          return false;
        }
      }
    }

    if (check_descendants) {
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const Descriptor* message_type = field->message_type();
          if (ABSL_PREDICT_FALSE(message_type->options().map_entry())) {
            if (message_type->field(1)->cpp_type() ==
                FieldDescriptor::CPPTYPE_MESSAGE) {
              const MapFieldBase* map_field =
                  reflection->GetMapData(message, field);
              if (map_field->IsMapValid()) {
                MapIterator it(const_cast<Message*>(&message), field);
                MapIterator end_map(const_cast<Message*>(&message), field);
                for (map_field->MapBegin(&it), map_field->MapEnd(&end_map);
                     it != end_map; ++it) {
                  if (!it.GetValueRef().GetMessageValue().IsInitialized()) {
                    return false;
                  }
                }
              }
            }
          } else if (field->is_repeated()) {
            const int size = reflection->FieldSize(message, field);
            for (int j = 0; j < size; j++) {
              if (!reflection->GetRepeatedMessage(message, field, j)
                       .IsInitialized()) {
                return false;
              }
            }
          } else if (reflection->HasField(message, field)) {
            if (!reflection->GetMessage(message, field).IsInitialized()) {
              return false;
            }
          }
        }
      }
    }
  }
  if (check_descendants && reflection->HasExtensionSet(message)) {
    // Note that "extendee" is only referenced if the extension is lazily parsed
    // (e.g. LazyMessageExtensionImpl), which requires a verification function
    // to be generated.
    //
    // Dynamic messages would get null prototype from the generated message
    // factory but their verification functions are not generated. Therefore, it
    // it will always be eagerly parsed and "extendee" here will not be
    // referenced.
    const Message* extendee =
        MessageFactory::generated_factory()->GetPrototype(descriptor);
    if (!reflection->GetExtensionSet(message).IsInitialized(extendee)) {
      return false;
    }
  }
  return true;
}